

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O0

pfq_ele * __thiscall CVmObjTadsInhQueue::alloc_ele(CVmObjTadsInhQueue *this)

{
  pfq_ele *ppVar1;
  long in_RDI;
  size_t i;
  pfq_page *pg;
  pfq_ele *ele;
  long local_20;
  undefined8 *local_10;
  
  if (*(long *)(in_RDI + 8) == 0) {
    local_10 = (undefined8 *)malloc(0x4b8);
    *local_10 = *(undefined8 *)(in_RDI + 0x10);
    *(undefined8 **)(in_RDI + 0x10) = local_10;
    local_10 = local_10 + 1;
    for (local_20 = 0x32; local_20 != 0; local_20 = local_20 + -1) {
      local_10[2] = *(undefined8 *)(in_RDI + 8);
      *(undefined8 **)(in_RDI + 8) = local_10;
      local_10 = local_10 + 3;
    }
  }
  ppVar1 = *(pfq_ele **)(in_RDI + 8);
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x10);
  return ppVar1;
}

Assistant:

pfq_ele *alloc_ele()
    {
        pfq_ele *ele;

        /* if we have nothing in the free list, allocate more elements */
        if (free_ == 0)
        {
            pfq_page *pg;
            size_t i;

            /* allocate another page */
            pg = (pfq_page *)t3malloc(sizeof(pfq_page));

            /* link it into our master page list */
            pg->nxt = alloc_;
            alloc_ = pg;

            /* link all of its elements into the free list */
            for (ele = pg->eles, i = sizeof(pg->eles)/sizeof(pg->eles[0]) ;
                 i != 0 ; --i, ++ele)
            {
                /* link this one into the free list */
                ele->nxt = free_;
                free_ = ele;
            }
        }

        /* take the next element off the free list */
        ele = free_;
        free_ = free_->nxt;

        /* return the element */
        return ele;
    }